

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O2

ElabSystemTaskKind __thiscall
slang::ast::SemanticFacts::getElabSystemTaskKind(SemanticFacts *this,Token token)

{
  bool bVar1;
  ElabSystemTaskKind EVar2;
  string_view __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __y_02;
  basic_string_view<char,_std::char_traits<char>_> __y_03;
  Token token_local;
  
  token_local.info = token._0_8_;
  token_local._0_8_ = this;
  __x = parsing::Token::valueText(&token_local);
  __y._M_str = "$fatal";
  __y._M_len = 6;
  bVar1 = std::operator==(__x,__y);
  EVar2 = Fatal;
  if (!bVar1) {
    __y_00._M_str = "$error";
    __y_00._M_len = 6;
    bVar1 = std::operator==(__x,__y_00);
    if (bVar1) {
      EVar2 = Error;
    }
    else {
      __y_01._M_str = "$warning";
      __y_01._M_len = 8;
      bVar1 = std::operator==(__x,__y_01);
      if (bVar1) {
        EVar2 = Warning;
      }
      else {
        __y_02._M_str = "$info";
        __y_02._M_len = 5;
        bVar1 = std::operator==(__x,__y_02);
        if (bVar1) {
          EVar2 = Info;
        }
        else {
          __y_03._M_str = "$static_assert";
          __y_03._M_len = 0xe;
          std::operator==(__x,__y_03);
          EVar2 = StaticAssert;
        }
      }
    }
  }
  return EVar2;
}

Assistant:

ElabSystemTaskKind SemanticFacts::getElabSystemTaskKind(Token token) {
    auto name = token.valueText();
    if (name == "$fatal"sv)
        return ElabSystemTaskKind::Fatal;
    if (name == "$error"sv)
        return ElabSystemTaskKind::Error;
    if (name == "$warning"sv)
        return ElabSystemTaskKind::Warning;
    if (name == "$info"sv)
        return ElabSystemTaskKind::Info;
    if (name == "$static_assert"sv)
        return ElabSystemTaskKind::StaticAssert;
    SLANG_UNREACHABLE;
}